

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Enum EVar1;
  pointer pCVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  Type TVar8;
  unsigned_long uVar9;
  ExpectedNan EVar10;
  long lVar11;
  ulong uVar12;
  char *s;
  Stream *pSVar13;
  long lVar14;
  Const *this_01;
  ulong uVar15;
  ulong uVar16;
  Type local_58;
  string local_50;
  
  Stream::Writef(this->json_stream_,"[");
  lVar14 = 0x40;
  uVar15 = 0;
  do {
    pCVar2 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar2;
    lVar11 = lVar7 % 0x50;
    if ((ulong)(lVar7 / 0x50) <= uVar15) {
      Stream::Writef(this->json_stream_,"]",lVar11);
      return;
    }
    Stream::Writef(this->json_stream_,"{",lVar11);
    WriteKey(this,"type");
    EVar1 = pCVar2[uVar15].type_.enum_;
    if (0x10 < (uint)(EVar1 + 0x11)) {
switchD_00148d99_caseD_fffffff1:
      abort();
    }
    this_01 = pCVar2 + uVar15;
    switch(EVar1) {
    case ExternRef:
      s = "externref";
      goto LAB_00148dec;
    case FuncRef:
      s = "funcref";
LAB_00148dec:
      WriteString(this,s);
      WriteSeparator(this);
      WriteKey(this,"value");
      WriteRefBits(this,*(uintptr_t *)(this_01->data_).v);
      break;
    default:
      goto switchD_00148d99_caseD_fffffff1;
    case V128:
      WriteString(this,"v128");
      WriteSeparator(this);
      WriteKey(this,"lane_type");
      local_58 = Const::lane_type(this_01);
      Type::GetName_abi_cxx11_(&local_50,&local_58);
      WriteString(this,local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"[");
      this_00 = &this_01->data_;
      for (uVar16 = 0; iVar5 = Const::lane_count(this_01), (long)uVar16 < (long)iVar5;
          uVar16 = uVar16 + 1) {
        TVar8 = Const::lane_type(this_01);
        iVar5 = (int)uVar16;
        switch(TVar8.enum_) {
        case I16:
          pSVar13 = this->json_stream_;
          uVar4 = v128::To<unsigned_short>(this_00,iVar5);
          uVar12 = (ulong)uVar4;
          goto LAB_00148f98;
        case I8:
          pSVar13 = this->json_stream_;
          bVar3 = v128::To<unsigned_char>(this_00,iVar5);
          uVar12 = (ulong)bVar3;
          goto LAB_00148f98;
        default:
          goto switchD_00148d99_caseD_fffffff1;
        case F64:
          uVar9 = v128::To<unsigned_long>(this_00,iVar5);
          EVar10 = None;
          if (uVar16 < 4) {
            EVar10 = *(ExpectedNan *)
                      ((long)&(((Const *)(&pCVar2->data_ + -3))->loc).filename + uVar16 * 4 + lVar14
                      );
          }
          WriteF64(this,uVar9,EVar10);
          break;
        case F32:
          uVar6 = v128::To<unsigned_int>(this_00,iVar5);
          EVar10 = None;
          if (uVar16 < 4) {
            EVar10 = *(ExpectedNan *)
                      ((long)&(((Const *)(&pCVar2->data_ + -3))->loc).filename + uVar16 * 4 + lVar14
                      );
          }
          WriteF32(this,uVar6,EVar10);
          break;
        case I64:
          pSVar13 = this->json_stream_;
          uVar9 = v128::To<unsigned_long>(this_00,iVar5);
          Stream::Writef(pSVar13,"\"%lu\"",uVar9);
          break;
        case I32:
          pSVar13 = this->json_stream_;
          uVar6 = v128::To<unsigned_int>(this_00,iVar5);
          uVar12 = (ulong)uVar6;
LAB_00148f98:
          Stream::Writef(pSVar13,"\"%u\"",uVar12);
        }
        iVar5 = Const::lane_count(this_01);
        if (uVar16 != iVar5 - 1) {
          WriteSeparator(this);
        }
      }
      Stream::Writef(this->json_stream_,"]");
      break;
    case F64:
      WriteString(this,"f64");
      WriteSeparator(this);
      WriteKey(this,"value");
      WriteF64(this,*(uint64_t *)(this_01->data_).v,this_01->nan_[0]);
      break;
    case F32:
      WriteString(this,"f32");
      WriteSeparator(this);
      WriteKey(this,"value");
      WriteF32(this,*(uint32_t *)(this_01->data_).v,this_01->nan_[0]);
      break;
    case I64:
      WriteString(this,"i64");
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"\"%lu\"",*(undefined8 *)(this_01->data_).v);
      break;
    case I32:
      WriteString(this,"i32");
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
    }
    Stream::Writef(this->json_stream_,"}");
    if (uVar15 != ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x50 - 1U) {
      WriteSeparator(this);
    }
    uVar15 = uVar15 + 1;
    lVar14 = lVar14 + 0x50;
  } while( true );
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}